

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
* __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true>>>
::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
          (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true>>>
          *this,ID_index cellID,initializer_list<std::pair<unsigned_int,_unsigned_int>_> *boundary,
          Dimension dim)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  uint local_70;
  uint local_68;
  uint local_30;
  uint local_2c;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> *piStack_28;
  Dimension dim_local;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> *boundary_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true>>>
  *pCStack_18;
  ID_index cellID_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
  *this_local;
  
  local_2c = dim;
  piStack_28 = boundary;
  boundary_local._4_4_ = cellID;
  pCStack_18 = this;
  this_local = (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                *)__return_storage_ptr__;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x68));
  if (sVar4 <= boundary_local._4_4_) {
    iVar2 = boundary_local._4_4_ * 2;
    local_30 = Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>
               ::get_null_value<unsigned_int>();
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x68),
               (ulong)(iVar2 + 1),&local_30);
  }
  uVar1 = local_2c;
  uVar3 = Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>
          ::get_null_value<int>();
  if (uVar1 == uVar3) {
    sVar4 = std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::size(piStack_28);
    if (sVar4 == 0) {
      local_68 = 0;
    }
    else {
      sVar4 = std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::size(piStack_28);
      local_68 = (int)sVar4 - 1;
    }
    local_70 = local_68;
  }
  else {
    local_70 = local_2c;
  }
  Matrix_all_dimension_holder<int>::update_up((Matrix_all_dimension_holder<int> *)this,local_70);
  _reduce_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (__return_storage_ptr__,this,boundary_local._4_4_,piStack_28,local_2c);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::insert_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  if constexpr (!Master_matrix::Option_list::has_map_column_container) {
    if (pivotToColumnIndex_.size() <= cellID) {
      pivotToColumnIndex_.resize(cellID * 2 + 1, Master_matrix::template get_null_value<Index>());
    }
  }

  if constexpr (Master_matrix::Option_list::has_vine_update && Master_matrix::Option_list::has_column_pairings) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      Swap_opt::CP::pivotToPosition_.try_emplace(cellID, _nextPosition());
    } else {
      if (Swap_opt::CP::pivotToPosition_.size() <= cellID)
        Swap_opt::CP::pivotToPosition_.resize(pivotToColumnIndex_.size(),
                                              Master_matrix::template get_null_value<Pos_index>());
      Swap_opt::CP::pivotToPosition_[cellID] = _nextPosition();
    }
  }

  if constexpr (Master_matrix::Option_list::has_matrix_maximal_dimension_access) {
    Dim_opt::update_up(dim == Master_matrix::template get_null_value<Dimension>()
                           ? (boundary.size() == 0 ? 0 : boundary.size() - 1)
                           : dim);
  }

  return _reduce_boundary(cellID, boundary, dim);
}